

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ios_prop.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  propery *ppVar5;
  runtime_error *prVar6;
  allocator local_359;
  string local_358;
  locale local_338 [8];
  stringstream ss2;
  undefined4 uStack_32c;
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  test_counter = test_counter + 1;
  bVar2 = booster::locale::impl::ios_prop<propery>::has
                    ((ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x26);
    poVar4 = std::operator<<(poVar4," !prop_type::has(ss)");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss2,"Error limits reached, stopping unit test",(allocator *)&local_358);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss2);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  if (ppVar5->x != -1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x27);
    poVar4 = std::operator<<(poVar4," prop_type::get(ss).x==-1");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss2,"Error limits reached, stopping unit test",(allocator *)&local_358);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss2);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar2 = booster::locale::impl::ios_prop<propery>::has
                    ((ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x28);
    poVar4 = std::operator<<(poVar4," prop_type::has(ss)");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss2,"Error limits reached, stopping unit test",(allocator *)&local_358);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss2);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (counter != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x29);
    poVar4 = std::operator<<(poVar4," counter==1");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss2,"Error limits reached, stopping unit test",(allocator *)&local_358);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss2);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  test_counter = test_counter + 1;
  if (counter != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x2b);
    poVar4 = std::operator<<(poVar4," counter==0");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)&ss2);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  counter = counter + 1;
  _ss2 = 1;
  booster::locale::impl::ios_prop<propery>::set
            ((propery *)&ss2,(ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  counter = counter + -1;
  test_counter = test_counter + 1;
  if (counter != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x2f);
    poVar4 = std::operator<<(poVar4," counter==1");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss2,"Error limits reached, stopping unit test",(allocator *)&local_358);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss2);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  if (ppVar5->x != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
    poVar4 = std::operator<<(poVar4," prop_type::get(ss).x==1");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss2,"Error limits reached, stopping unit test",(allocator *)&local_358);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss2);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  test_counter = test_counter + 1;
  if (counter != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x32);
    poVar4 = std::operator<<(poVar4," counter==0");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)&ss2);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  counter = counter + 1;
  _ss2 = 1;
  booster::locale::impl::ios_prop<propery>::set
            ((propery *)&ss2,(ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  counter = counter + -1;
  test_counter = test_counter + 1;
  if (counter != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x36);
    poVar4 = std::operator<<(poVar4," counter==1");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss2,"Error limits reached, stopping unit test",(allocator *)&local_358);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss2);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  if (ppVar5->x != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x37);
    poVar4 = std::operator<<(poVar4," prop_type::get(ss).x==1");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss2,"Error limits reached, stopping unit test",(allocator *)&local_358);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss2);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  test_counter = test_counter + 1;
  if (counter != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x39);
    poVar4 = std::operator<<(poVar4," counter==0");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)&ss2);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss2);
  counter = counter + 1;
  local_358._M_dataplus._M_p._0_4_ = 2;
  booster::locale::impl::ios_prop<propery>::set
            ((propery *)&local_358,(ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  counter = counter + -1;
  std::ios::copyfmt((ios *)((stringstream *)&ss2 + *(long *)(CONCAT44(uStack_32c,_ss2) + -0x18)));
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  if (ppVar5->x != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3e);
    poVar4 = std::operator<<(poVar4," prop_type::get(ss).x==2");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_358,"Error limits reached, stopping unit test",&local_359);
      booster::runtime_error::runtime_error(prVar6,&local_358);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar2 = booster::locale::impl::ios_prop<propery>::has
                    ((ios_base *)
                     ((stringstream *)&ss2 + *(long *)(CONCAT44(uStack_32c,_ss2) + -0x18)));
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3f);
    poVar4 = std::operator<<(poVar4," prop_type::has(ss2)");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_358,"Error limits reached, stopping unit test",&local_359);
      booster::runtime_error::runtime_error(prVar6,&local_358);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar2 = booster::locale::impl::ios_prop<propery>::has
                    ((ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x40);
    poVar4 = std::operator<<(poVar4," prop_type::has(ss)");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_358,"Error limits reached, stopping unit test",&local_359);
      booster::runtime_error::runtime_error(prVar6,&local_358);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((stringstream *)&ss2 + *(long *)(CONCAT44(uStack_32c,_ss2) + -0x18)));
  if (ppVar5->x != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x41);
    poVar4 = std::operator<<(poVar4," prop_type::get(ss2).x==2");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_358,"Error limits reached, stopping unit test",&local_359);
      booster::runtime_error::runtime_error(prVar6,&local_358);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((stringstream *)&ss2 + *(long *)(CONCAT44(uStack_32c,_ss2) + -0x18)));
  ppVar5->x = 3;
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)
                      ((stringstream *)&ss2 + *(long *)(CONCAT44(uStack_32c,_ss2) + -0x18)));
  if (ppVar5->x != 3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x43);
    poVar4 = std::operator<<(poVar4," prop_type::get(ss2).x==3");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_358,"Error limits reached, stopping unit test",&local_359);
      booster::runtime_error::runtime_error(prVar6,&local_358);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar5 = booster::locale::impl::ios_prop<propery>::get
                     ((ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)));
  if (ppVar5->x != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x44);
    poVar4 = std::operator<<(poVar4," prop_type::get(ss).x==2");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_358,"Error limits reached, stopping unit test",&local_359);
      booster::runtime_error::runtime_error(prVar6,&local_358);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (counter != 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x45);
    poVar4 = std::operator<<(poVar4," counter==2");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_358,"Error limits reached, stopping unit test",&local_359);
      booster::runtime_error::runtime_error(prVar6,&local_358);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (imbued != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x46);
    poVar4 = std::operator<<(poVar4," imbued==0");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_358,"Error limits reached, stopping unit test",&local_359);
      booster::runtime_error::runtime_error(prVar6,&local_358);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::classic();
  std::ios::imbue(local_338);
  std::locale::~locale(local_338);
  test_counter = test_counter + 1;
  if (imbued != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x48);
    poVar4 = std::operator<<(poVar4," imbued==1");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_358,"Error limits reached, stopping unit test",&local_359);
      booster::runtime_error::runtime_error(prVar6,&local_358);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss2);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  test_counter = test_counter + 1;
  if (counter != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4a);
    poVar4 = std::operator<<(poVar4," counter==0");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)&ss2);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  iVar3 = test_counter - error_counter;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar4 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
  poVar4 = std::operator<<(poVar4," tests");
  std::endl<char,std::char_traits<char>>(poVar4);
  if (0 < error_counter) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,error_counter);
    poVar4 = std::operator<<(poVar4," tests");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<((ostream *)&std::cout," ");
  lVar1 = *(long *)poVar4;
  *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 1;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  poVar4 = std::ostream::_M_insert<double>(((double)iVar3 * 100.0) / (double)test_counter);
  poVar4 = std::operator<<(poVar4,"% of tests completed sucsessefully");
  std::endl<char,std::char_traits<char>>(poVar4);
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        {
            std::stringstream ss;
            TEST(!prop_type::has(ss));
            TEST(prop_type::get(ss).x==-1);
            TEST(prop_type::has(ss));
            TEST(counter==1);
        }
        TEST(counter==0);
        {
            std::stringstream ss;
            prop_type::set(propery(1),ss);
            TEST(counter==1);
            TEST(prop_type::get(ss).x==1);
        }
        TEST(counter==0);
        {
            std::stringstream ss;
            prop_type::set(propery(1),ss);
            TEST(counter==1);
            TEST(prop_type::get(ss).x==1);
        }
        TEST(counter==0);
        {
            std::stringstream ss,ss2;
            prop_type::set(propery(2),ss);
            ss2.copyfmt(ss);
            TEST(prop_type::get(ss).x==2);
            TEST(prop_type::has(ss2));
            TEST(prop_type::has(ss));
            TEST(prop_type::get(ss2).x==2);
            prop_type::get(ss2).x=3;
            TEST(prop_type::get(ss2).x==3);
            TEST(prop_type::get(ss).x==2);
            TEST(counter==2);
            TEST(imbued==0);
            ss2.imbue(std::locale::classic());
            TEST(imbued==1);
        }
        TEST(counter==0);
    }catch(std::exception const &e) {
        std::cerr << "Fail:" << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
    return 0;
}